

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex11.cpp
# Opt level: O0

vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> * __thiscall
SkipList::GetUpperNodes
          (vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> *__return_storage_ptr__,
          SkipList *this,int inKey)

{
  size_type sVar1;
  int iVar2;
  int local_2c;
  Node *pNStack_28;
  int lvl;
  Node *node;
  int inKey_local;
  SkipList *this_local;
  vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> *upperNodes;
  
  pNStack_28 = this->header->next;
  local_2c = this->height;
  std::vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::vector(__return_storage_ptr__);
  std::vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::reserve
            (__return_storage_ptr__,(long)this->height);
  do {
    iVar2 = local_2c + -1;
    if (local_2c == 0) {
      iVar2 = this->height;
      sVar1 = std::vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::size
                        (__return_storage_ptr__);
      if ((long)iVar2 == sVar1) {
        return __return_storage_ptr__;
      }
      __assert_fail("(height == upperNodes.size()) && \"upperNodes contains more nodes than height of list\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vocasle[P]principles_and_practice_using_cpp/part_3_data_and_algorithms/ch_18/p3ch18ex11.cpp"
                    ,0x11b,"std::vector<Node *> SkipList::GetUpperNodes(const int) const");
    }
    for (; local_2c = iVar2, pNStack_28 != (Node *)0x0; pNStack_28 = pNStack_28->next) {
      if ((inKey <= pNStack_28->key) || (pNStack_28->next == (Node *)0x0)) {
        std::vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::push_back
                  (__return_storage_ptr__,&pNStack_28->prev);
        pNStack_28 = pNStack_28->prev->bot;
        break;
      }
    }
  } while( true );
}

Assistant:

std::vector<Node*> SkipList::GetUpperNodes(const int inKey) const
{
	Node* node = header->next;
	int lvl = height;
	std::vector<Node*> upperNodes;
	upperNodes.reserve(height);
	while (lvl-- != 0)
	{
		while (node)
		{
			if (node->key < inKey && node->next)
			{
				node = node->next;
			}
			else
			{
				upperNodes.push_back(node->prev);
				node = node->prev->bot;
				break;
			}
		}
	}

	assert((height == upperNodes.size()) && "upperNodes contains more nodes than height of list");

	return upperNodes;
}